

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

void __thiscall spvtools::opt::IRContext::KillNamesAndDecorates(IRContext *this,uint32_t id)

{
  uint32_t id_00;
  bool bVar1;
  DecorationManager *this_00;
  reference ppVar2;
  reference ppIVar3;
  Instruction *name_inst;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_1;
  pair<const_unsigned_int,_spvtools::opt::Instruction_*> name;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> __end2;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> __begin2;
  IteratorRange<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> name_to_kill;
  function<bool_(const_spvtools::opt::Instruction_&)> local_40;
  DecorationManager *local_20;
  DecorationManager *dec_mgr;
  IRContext *pIStack_10;
  uint32_t id_local;
  IRContext *this_local;
  
  dec_mgr._4_4_ = id;
  pIStack_10 = this;
  this_00 = get_decoration_mgr(this);
  id_00 = dec_mgr._4_4_;
  local_20 = this_00;
  std::function<bool(spvtools::opt::Instruction_const&)>::
  function<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::_default_arg_1_::_lambda(spvtools::opt::Instruction_const&)_1_,void>
            ((function<bool(spvtools::opt::Instruction_const&)> *)&local_40,
             (anon_class_1_0_00000001 *)
             ((long)&name_to_kill.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  analysis::DecorationManager::RemoveDecorationsFrom(this_00,id_00,&local_40);
  std::function<bool_(const_spvtools::opt::Instruction_&)>::~function(&local_40);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2);
  ___begin2 = GetNames(this,dec_mgr._4_4_);
  __end2 = IteratorRange<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
           ::begin((IteratorRange<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                    *)&__begin2);
  name.second = (Instruction *)
                IteratorRange<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                ::end((IteratorRange<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                       *)&__begin2);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&name.second);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>::
             operator*(&__end2);
    name._0_8_ = ppVar2->second;
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )&__range2,(value_type *)&name);
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>::operator++
              (&__end2);
  }
  __end2_1 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)&__range2);
  name_inst = (Instruction *)
              std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&__range2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                        *)&name_inst);
    if (!bVar1) break;
    ppIVar3 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2_1);
    KillInst(this,*ppIVar3);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2_1);
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2);
  return;
}

Assistant:

void IRContext::KillNamesAndDecorates(uint32_t id) {
  analysis::DecorationManager* dec_mgr = get_decoration_mgr();
  dec_mgr->RemoveDecorationsFrom(id);

  std::vector<Instruction*> name_to_kill;
  for (auto name : GetNames(id)) {
    name_to_kill.push_back(name.second);
  }
  for (Instruction* name_inst : name_to_kill) {
    KillInst(name_inst);
  }
}